

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryMonitor.cpp
# Opt level: O0

void __thiscall SAXErrorHandler::warning(SAXErrorHandler *this,SAXParseException *exc)

{
  ostream *poVar1;
  wchar16 *pwVar2;
  char *local_20;
  char *message;
  SAXParseException *exc_local;
  SAXErrorHandler *this_local;
  
  local_20 = (char *)0x0;
  message = (char *)exc;
  exc_local = (SAXParseException *)this;
  poVar1 = std::operator<<((ostream *)&std::cerr,"SAX warning received!  Text:  ");
  pwVar2 = (wchar16 *)(**(code **)(*(long *)message + 0x10))();
  local_20 = (char *)xercesc_4_0::XMLString::transcode
                               (pwVar2,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  poVar1 = std::operator<<(poVar1,local_20);
  poVar1 = std::operator<<(poVar1,".");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  xercesc_4_0::XMLString::release(&local_20,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  return;
}

Assistant:

void warning(const SAXParseException &exc )
    {
        char *message = 0;
        std::cerr << "SAX warning received!  Text:  " <<
            (message = XMLString::transcode(exc.getMessage())) << "." << std::endl;
        XMLString::release(&message);
    }